

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtTriangleInfo>::resize
          (cbtAlignedObjectArray<cbtTriangleInfo> *this,int newsize,cbtTriangleInfo *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = this->m_size;
  lVar5 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar4 = lVar5 << 4;
    for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
      uVar3 = *(undefined8 *)&fillData->m_edgeV1V2Angle;
      puVar1 = (undefined8 *)((long)&this->m_data->m_flags + lVar4);
      *puVar1 = *(undefined8 *)fillData;
      puVar1[1] = uVar3;
      lVar4 = lVar4 + 0x10;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}